

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O0

int main(void)

{
  test_value_ctor();
  test_string_traits();
  test_custom_storage();
  test_bool_storage();
  test_unsafe_raw_value();
  test_evp_fp_nan();
  test_evp_value_init();
  test_evp_stl_empty();
  test_evp_raw_storage();
  test_evp_enum();
  return 0;
}

Assistant:

int main()
{
  test_value_ctor();
  test_string_traits();
  test_custom_storage();
  test_bool_storage();
  test_unsafe_raw_value();
  test_evp_fp_nan();
  test_evp_value_init();
  test_evp_stl_empty();
  test_evp_raw_storage();
#if defined AK_TOOLBOX_USING_BOOST
  test_optional_as_storage();
#endif
  test_evp_enum();
}